

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O0

_Bool intersect_box3_sphere(box3_t b,vec3_t c,float r)

{
  float fVar1;
  float fVar2;
  undefined4 local_2c;
  float dist;
  float r_local;
  undefined4 local_14;
  undefined4 uStack_10;
  vec3_t c_local;
  
  fVar2 = c.z;
  local_2c = 0.0;
  local_14 = c.x;
  if (b.min.x <= local_14) {
    if (b.max.x < local_14) {
      local_2c = sqrf(local_14 - b.max.x);
      local_2c = local_2c + 0.0;
    }
  }
  else {
    local_2c = sqrf(local_14 - b.min.x);
    local_2c = local_2c + 0.0;
  }
  uStack_10 = c.y;
  if (b.min.y <= uStack_10) {
    if (b.max.y < uStack_10) {
      fVar1 = sqrf(uStack_10 - b.max.y);
      local_2c = fVar1 + local_2c;
    }
  }
  else {
    fVar1 = sqrf(uStack_10 - b.min.y);
    local_2c = fVar1 + local_2c;
  }
  if (b.min.z <= fVar2) {
    if (b.max.z < fVar2) {
      fVar2 = sqrf(fVar2 - b.max.z);
      local_2c = fVar2 + local_2c;
    }
  }
  else {
    fVar2 = sqrf(fVar2 - b.min.z);
    local_2c = fVar2 + local_2c;
  }
  return local_2c < r * r;
}

Assistant:

bool
intersect_box3_sphere(box3_t b, vec3_t c, float r) {
    float dist = 0.0f;

    if (c.x < b.min.x) { dist += sqrf(c.x - b.min.x); }
    else if (c.x > b.max.x) { dist += sqrf(c.x - b.max.x); }

    if (c.y < b.min.y) { dist += sqrf(c.y - b.min.y); }
    else if (c.y > b.max.y) { dist += sqrf(c.y - b.max.y); }

    if (c.z < b.min.z) { dist += sqrf(c.z - b.min.z); }
    else if (c.z > b.max.z) { dist += sqrf(c.z - b.max.z); }

    return r * r > dist;
}